

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

void __thiscall
QAccessibleAbstractScrollArea::QAccessibleAbstractScrollArea
          (QAccessibleAbstractScrollArea *this,QWidget *widget)

{
  long lVar1;
  undefined8 in_RSI;
  Role role;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QAccessibleWidget *in_stack_ffffffffffffffe0;
  
  role = (Role)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  w = in_RDI;
  QString::QString((QString *)0x7d57d2);
  QAccessibleWidget::QAccessibleWidget(in_stack_ffffffffffffffe0,w,role,(QString *)in_RDI);
  QString::~QString((QString *)0x7d57f4);
  *(undefined ***)in_RDI = &PTR__QAccessibleAbstractScrollArea_00d27728;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QAccessibleAbstractScrollArea_00d277f8;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleAbstractScrollArea::QAccessibleAbstractScrollArea(QWidget *widget)
    : QAccessibleWidget(widget, QAccessible::Client)
{
    Q_ASSERT(qobject_cast<QAbstractScrollArea *>(widget));
}